

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::internal::grisu2_format_positive(double value,char *buffer,size_t *size,int *dec_exp)

{
  int *this;
  undefined1 auVar1 [12];
  fp fVar2;
  fp fVar3;
  fp x;
  fp y;
  fp y_00;
  fp y_01;
  uint64_t delta;
  undefined1 local_118 [8];
  fp scaled_upper;
  fp scaled_lower;
  undefined4 uStack_a0;
  undefined1 local_90 [8];
  fp scaled_value;
  fp dec_pow;
  undefined1 auStack_58 [4];
  int min_exp;
  fp upper;
  fp lower;
  fp fp_value;
  int *dec_exp_local;
  size_t *size_local;
  char *buffer_local;
  double value_local;
  
  if (value <= 0.0) {
    __assert_fail("(value > 0) && \"value is nonpositive\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/format-inl.h"
                  ,0x204,
                  "void fmt::internal::grisu2_format_positive(double, char *, size_t &, int &)");
  }
  this = &lower.e;
  fp::fp<double>((fp *)this,value);
  fp::fp((fp *)&upper.e);
  fp::fp((fp *)auStack_58);
  fp::compute_boundaries((fp *)this,(fp *)&upper.e,(fp *)auStack_58);
  fVar2 = get_cached_power(-0x7c - (int)upper.f,dec_exp);
  scaled_value._8_8_ = fVar2.f;
  *dec_exp = -*dec_exp;
  fp::normalize<0>((fp *)this);
  uStack_a0 = (undefined4)fp_value.f;
  fVar3.e = uStack_a0;
  fVar3.f = lower._8_8_;
  auVar1 = fVar2._0_12_;
  fVar3._12_4_ = 0;
  y._12_4_ = 0;
  y.f = auVar1._0_8_;
  y.e = auVar1._8_4_;
  fVar2 = operator*(fVar3,y);
  local_90 = (undefined1  [8])fVar2.f;
  scaled_value.f._0_4_ = fVar2.e;
  fVar2.e = (undefined4)lower.f;
  fVar2.f = upper._8_8_;
  fVar2._12_4_ = 0;
  y_00._12_4_ = 0;
  y_00.f = auVar1._0_8_;
  y_00.e = auVar1._8_4_;
  fVar2 = operator*(fVar2,y_00);
  x.e = (int)upper.f;
  x.f = _auStack_58;
  x._12_4_ = 0;
  y_01._12_4_ = 0;
  y_01.f = auVar1._0_8_;
  y_01.e = auVar1._8_4_;
  scaled_upper._8_8_ = fVar2.f;
  fVar3 = operator*(x,y_01);
  scaled_upper.f._0_4_ = fVar3.e;
  local_118 = (undefined1  [8])(fVar3.f - 1);
  grisu2_gen_digits((fp *)local_90,(fp *)local_118,(long)local_118 - (fVar2.f + 1),buffer,size,
                    dec_exp);
  return;
}

Assistant:

FMT_FUNC void grisu2_format_positive(double value, char *buffer, size_t &size,
                                     int &dec_exp) {
  FMT_ASSERT(value > 0, "value is nonpositive");
  fp fp_value(value);
  fp lower, upper;  // w^- and w^+ in the Grisu paper.
  fp_value.compute_boundaries(lower, upper);
  // Find a cached power of 10 close to 1 / upper.
  const int min_exp = -60;  // alpha in Grisu.
  auto dec_pow = get_cached_power(  // \tilde{c}_{-k} in Grisu.
      min_exp - (upper.e + fp::significand_size), dec_exp);
  dec_exp = -dec_exp;
  fp_value.normalize();
  fp scaled_value = fp_value * dec_pow;
  fp scaled_lower = lower * dec_pow;  // \tilde{M}^- in Grisu.
  fp scaled_upper = upper * dec_pow;  // \tilde{M}^+ in Grisu.
  ++scaled_lower.f;  // \tilde{M}^- + 1 ulp -> M^-_{\uparrow}.
  --scaled_upper.f;  // \tilde{M}^+ - 1 ulp -> M^+_{\downarrow}.
  uint64_t delta = scaled_upper.f - scaled_lower.f;
  grisu2_gen_digits(scaled_value, scaled_upper, delta, buffer, size, dec_exp);
}